

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dymon_srv.cpp
# Opt level: O2

void m_print_thread(void)

{
  cJSON *json;
  int iVar1;
  cJSON *in_RAX;
  cJSON *json_00;
  cJSON *labels;
  cJSON *local_28;
  
  local_28 = in_RAX;
  do {
    MessageQueue<cJSON_*,_32U>::pop(&m_LabelQueue,&local_28);
    json = local_28;
    json_00 = cJSON_GetObjectItemCaseSensitive(local_28,"ip");
    iVar1 = PrintJson::start(printJson,json_00);
    if (iVar1 == 0) {
      PrintJson::print(printJson,json);
    }
    PrintJson::end(printJson);
    cJSON_Delete(local_28);
  } while( true );
}

Assistant:

static void m_print_thread()
{
   cJSON * labels;

   while (true)
   {
      //get next print request out of the queue. wait until one become available
      m_LabelQueue.pop(labels);
      //print the labels
      m_print_labels(labels);
      //cleanup JSON
      cJSON_Delete(labels);
   }
}